

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O3

void Cut_CellPrecompute(void)

{
  uint uVar1;
  short *psVar2;
  short sVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Cut_CMan_t *p;
  int *piVar8;
  Cut_Cell_t *pCVar9;
  long lVar10;
  Cut_Cell_t *pCell;
  ulong uVar11;
  uint uVar12;
  uint (*pauVar13) [16];
  int *piVar14;
  uint uVar15;
  ulong in_R9;
  uint *puVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar25;
  int iVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  timespec ts;
  long local_d8;
  timespec local_c8;
  long local_b8;
  int *local_b0;
  uint (*local_a8) [16];
  uint *local_a0;
  ulong local_98;
  uint *local_90;
  undefined8 local_88;
  int iStack_80;
  int iStack_7c;
  undefined1 local_78 [16];
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  undefined8 local_58;
  int iStack_50;
  int iStack_4c;
  ulong local_40;
  ulong local_38;
  long lVar24;
  
  iVar5 = clock_gettime(3,&local_c8);
  if (iVar5 < 0) {
    local_b8 = -1;
  }
  else {
    local_b8 = local_c8.tv_nsec / 1000 + local_c8.tv_sec * 1000000;
  }
  p = Cut_CManStart();
  pauVar13 = p->uTemp1;
  lVar18 = 0;
  local_88 = pauVar13;
  do {
    Cut_CellTruthElem(p->uInputs[0],p->uInputs[1],p->uInputs[2],*pauVar13,(int)lVar18,(int)in_R9);
    lVar18 = lVar18 + 1;
    pauVar13 = pauVar13 + 1;
  } while (lVar18 != 0x16);
  pauVar13 = p->uTemp2;
  lVar18 = 0;
  local_78._0_8_ = pauVar13;
  do {
    Cut_CellTruthElem(p->uInputs[3],p->uInputs[4],p->uInputs[5],*pauVar13,(int)lVar18,(int)in_R9);
    lVar18 = lVar18 + 1;
    pauVar13 = pauVar13 + 1;
  } while (lVar18 != 0x16);
  pauVar13 = p->uTemp3;
  lVar18 = 0;
  local_58 = pauVar13;
  do {
    Cut_CellTruthElem(p->uInputs[6],p->uInputs[7],p->uInputs[8],*pauVar13,(int)lVar18,(int)in_R9);
    lVar18 = lVar18 + 1;
    pauVar13 = pauVar13 + 1;
  } while (lVar18 != 0x16);
  local_90 = p->puAux;
  local_b0 = p->nSymGroups;
  piVar8 = p->nSymGroupsE;
  local_d8 = 0;
  local_68 = -0x80000000;
  iStack_64 = 0x80000000;
  iStack_60 = 0x80000000;
  iStack_5c = 0x80000000;
  do {
    lVar18 = 0;
    do {
      local_a8 = local_88 + lVar18;
      lVar17 = 0;
      do {
        local_a0 = (uint *)(lVar17 * 0x40 + local_78._0_8_);
        lVar19 = 0;
        do {
          pCVar9 = (Cut_Cell_t *)Extra_MmFixedEntryFetch(p->pMem);
          memset(pCVar9,0,0x98);
          *(undefined4 *)&pCVar9->field_0x20 = 9;
          iVar5 = s_NPNe3[local_d8];
          pCVar9->Box[0] = (char)iVar5;
          pCVar9->Box[1] = (char)lVar18;
          pCVar9->Box[2] = (char)lVar17;
          pCVar9->Box[3] = (char)lVar19;
          auVar26 = _DAT_0087b190;
          auVar23 = _DAT_007ee2e0;
          lVar10 = 0;
          auVar21 = _DAT_007ee2d0;
          do {
            if (SUB164(auVar21 ^ auVar23,4) == local_68 &&
                SUB164(auVar21 ^ auVar23,0) < auVar26._0_4_) {
              pCVar9->CanonPerm[lVar10] = (char)lVar10;
              pCVar9->CanonPerm[lVar10 + 1] = (char)lVar10 + '\x01';
            }
            lVar10 = lVar10 + 2;
            lVar24 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + 2;
            auVar21._8_8_ = lVar24 + 2;
          } while (lVar10 != 10);
          Cut_CellTruthElem(*local_a8,local_a0,local_58[lVar19],pCVar9->uTruth,iVar5,(int)in_R9);
          Cut_CellSuppMin(pCVar9);
          psVar2 = pCVar9->Store;
          uVar6 = Extra_TruthSemiCanonicize
                            (pCVar9->uTruth,local_90,*(uint *)&pCVar9->field_0x20 & 0xf,
                             pCVar9->CanonPerm,psVar2);
          *(uint *)&pCVar9->field_0x20 = *(uint *)&pCVar9->field_0x20 & 0x3fff | uVar6 << 0xe;
          p->nTotal = p->nTotal + 1;
          iVar5 = Cut_CellTableLookup(p,pCVar9);
          if (iVar5 == 0) {
            p->nGood = p->nGood + 1;
            p->nVarCounts[*(uint *)&pCVar9->field_0x20 & 0xf] =
                 p->nVarCounts[*(uint *)&pCVar9->field_0x20 & 0xf] + 1;
            uVar6 = *(uint *)&pCVar9->field_0x20;
            in_R9 = (ulong)(uVar6 & 0xf);
            if (1 < (uVar6 & 0xf)) {
              uVar15 = 0;
              do {
                sVar3 = psVar2[(int)(uVar15 * 2)];
                uVar12 = uVar15 + 1;
                if (sVar3 == psVar2[(int)(uVar15 * 2 + 2)]) {
                  uVar20 = (ulong)uVar12;
                  if ((int)uVar12 < (int)in_R9) {
                    puVar16 = pCVar9->uTruth + (long)(int)uVar15 + -8;
                    uVar11 = (long)(int)uVar15 + 1;
                    do {
                      uVar20 = uVar11;
                      if (sVar3 != (short)*puVar16) break;
                      uVar11 = uVar11 + 1;
                      puVar16 = puVar16 + 1;
                      uVar20 = in_R9;
                    } while (in_R9 != uVar11);
                  }
                  piVar14 = local_b0;
                  if (sVar3 == pCVar9->Store[(int)(uVar15 * 2 | 1)]) {
                    piVar14 = piVar8;
                  }
                  piVar14[(int)((uint)uVar20 - uVar15)] = piVar14[(int)((uint)uVar20 - uVar15)] + 1;
                  uVar6 = *(uint *)&pCVar9->field_0x20;
                  uVar12 = (uint)uVar20;
                }
                uVar15 = uVar12;
                in_R9 = (ulong)(uVar6 & 0xf);
              } while ((int)uVar15 < (int)((uVar6 & 0xf) - 1));
            }
          }
          else {
            Extra_MmFixedEntryRecycle(p->pMem,(char *)pCVar9);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x16);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x16);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x16);
    local_d8 = local_d8 + 1;
  } while (local_d8 != 10);
  iVar5 = 0x87b314;
  printf("BASIC: Total = %d. Good = %d. Entry = %d. ",(ulong)(uint)p->nTotal,(ulong)(uint)p->nGood);
  Abc_Print(iVar5,"%s =","Time");
  iVar7 = 3;
  iVar5 = clock_gettime(3,&local_c8);
  if (iVar5 < 0) {
    lVar18 = -1;
  }
  else {
    lVar18 = local_c8.tv_nsec / 1000 + local_c8.tv_sec * 1000000;
  }
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar18 - local_b8) / 1000000.0);
  printf("Cells:  ");
  uVar20 = 0;
  do {
    printf("%d=%d ",uVar20 & 0xffffffff,(ulong)(uint)p->nVarCounts[uVar20]);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 10);
  printf("\nDiffs:  ");
  uVar20 = 0;
  do {
    printf("%d=%d ",uVar20 & 0xffffffff,(ulong)(uint)p->nSymGroups[uVar20]);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 10);
  printf("\nEquals: ");
  uVar20 = 0;
  do {
    printf("%d=%d ",uVar20 & 0xffffffff,(ulong)(uint)p->nSymGroupsE[uVar20]);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 10);
  putchar(10);
  uVar20 = 9;
  local_58 = (uint (*) [16])0x8000000080000000;
  iStack_50 = -0x7fffffff;
  iStack_4c = -0x7fffffff;
  local_68 = -0x80000000;
  iStack_64 = -0x80000000;
  iStack_60 = -0x80000000;
  iStack_5c = -0x80000000;
  local_78._8_4_ = 0x80000003;
  local_78._0_8_ = 0x8000000280000002;
  local_78._12_4_ = 0x80000003;
  local_88 = (uint (*) [16])0x8000000080000000;
  iStack_80 = -0x80000000;
  iStack_7c = -0x80000000;
  do {
    pCVar9 = p->pSameVar[uVar20];
    uVar11 = uVar20;
    for (; pCVar9 != (Cut_Cell_t *)0x0; pCVar9 = pCVar9->pNextVar) {
      local_98 = 0;
      local_40 = uVar20;
      do {
        iVar5 = (int)local_98;
        uVar20 = (ulong)(iVar5 + 1);
        local_98 = uVar20;
        if (uVar20 < uVar11) {
          do {
            local_a8 = (uint (*) [16])CONCAT44(local_a8._4_4_,((uint)uVar20 & 0xf) << 8);
            iVar7 = 0;
            local_38 = uVar20;
            do {
              pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch(p->pMem);
              memset(pCell,0,0x98);
              uVar6 = *(uint *)&pCVar9->field_0x20 & 0xf;
              *(uint *)&pCell->field_0x20 = uVar6;
              pCell->pParent = pCVar9;
              auVar23._8_4_ = 0xffffffff;
              auVar23._0_8_ = 0xffffffffffffffff;
              auVar23._12_4_ = 0xffffffff;
              if (uVar6 != 0) {
                lVar18 = (ulong)uVar6 - 1;
                auVar26._8_4_ = (int)lVar18;
                auVar26._0_8_ = lVar18;
                auVar26._12_4_ = (int)((ulong)lVar18 >> 0x20);
                auVar26 = auVar26 ^ _DAT_007ee2e0;
                iVar25 = auVar26._0_4_;
                auVar27._4_4_ = auVar26._4_4_;
                iVar28 = auVar26._8_4_;
                auVar27._12_4_ = auVar26._12_4_;
                auVar37._0_4_ = -(uint)(iVar25 < (int)local_58);
                auVar37._4_4_ = -(uint)(iVar25 < local_58._4_4_);
                auVar37._8_4_ = -(uint)(iVar28 < iStack_50);
                auVar37._12_4_ = -(uint)(iVar28 < iStack_4c);
                auVar27._0_4_ = auVar27._4_4_;
                auVar27._8_4_ = auVar27._12_4_;
                auVar29._0_4_ = -(uint)(local_68 == auVar27._4_4_);
                auVar29._4_4_ = -(uint)(iStack_64 == auVar27._4_4_);
                auVar29._8_4_ = -(uint)(iStack_60 == auVar27._12_4_);
                auVar29._12_4_ = -(uint)(iStack_5c == auVar27._12_4_);
                auVar29 = auVar29 & auVar37;
                auVar26 = pshuflw(auVar37,auVar29,0xe8);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  pCell->CanonPerm[0] = '\0';
                }
                auVar26 = packssdw(auVar29,auVar29);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._0_4_ >> 8 & 1) != 0) {
                  pCell->CanonPerm[1] = '\x01';
                }
                auVar38._0_4_ = -(uint)(iVar25 < (int)local_78._0_4_);
                auVar38._4_4_ = -(uint)(iVar25 < (int)local_78._4_4_);
                auVar38._8_4_ = -(uint)(iVar28 < (int)local_78._8_4_);
                auVar38._12_4_ = -(uint)(iVar28 < (int)local_78._12_4_);
                auVar30._0_4_ = -(uint)((int)local_88 == auVar27._4_4_);
                auVar30._4_4_ = -(uint)(local_88._4_4_ == auVar27._4_4_);
                auVar30._8_4_ = -(uint)(iStack_80 == auVar27._12_4_);
                auVar30._12_4_ = -(uint)(iStack_7c == auVar27._12_4_);
                auVar30 = auVar30 & auVar38;
                auVar26 = packssdw(auVar38,auVar30);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._0_4_ >> 0x10 & 1) != 0) {
                  pCell->CanonPerm[2] = '\x02';
                }
                auVar26 = pshufhw(auVar30,auVar30,0x84);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._0_4_ >> 0x18 & 1) != 0) {
                  pCell->CanonPerm[3] = '\x03';
                }
                auVar39._0_4_ = -(uint)(iVar25 < -0x7ffffffc);
                auVar39._4_4_ = -(uint)(iVar25 < -0x7ffffffc);
                auVar39._8_4_ = -(uint)(iVar28 < -0x7ffffffb);
                auVar39._12_4_ = -(uint)(iVar28 < -0x7ffffffb);
                auVar31._0_4_ = -(uint)(auVar27._4_4_ == -0x80000000);
                auVar31._4_4_ = -(uint)(auVar27._4_4_ == -0x80000000);
                auVar31._8_4_ = -(uint)(auVar27._12_4_ == -0x80000000);
                auVar31._12_4_ = -(uint)(auVar27._12_4_ == -0x80000000);
                auVar31 = auVar31 & auVar39;
                auVar26 = pshuflw(auVar39,auVar31,0xe8);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  pCell->CanonPerm[4] = '\x04';
                }
                auVar26 = packssdw(auVar31,auVar31);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._4_2_ >> 8 & 1) != 0) {
                  pCell->CanonPerm[5] = '\x05';
                }
                auVar40._0_4_ = -(uint)(iVar25 < -0x7ffffffa);
                auVar40._4_4_ = -(uint)(iVar25 < -0x7ffffffa);
                auVar40._8_4_ = -(uint)(iVar28 < -0x7ffffff9);
                auVar40._12_4_ = -(uint)(iVar28 < -0x7ffffff9);
                auVar32._0_4_ = -(uint)(auVar27._4_4_ == -0x80000000);
                auVar32._4_4_ = -(uint)(auVar27._4_4_ == -0x80000000);
                auVar32._8_4_ = -(uint)(auVar27._12_4_ == -0x80000000);
                auVar32._12_4_ = -(uint)(auVar27._12_4_ == -0x80000000);
                auVar32 = auVar32 & auVar40;
                auVar26 = packssdw(auVar40,auVar32);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  pCell->CanonPerm[6] = '\x06';
                }
                auVar26 = pshufhw(auVar32,auVar32,0x84);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._6_2_ >> 8 & 1) != 0) {
                  pCell->CanonPerm[7] = '\a';
                }
                auVar41._0_4_ = -(uint)(iVar25 < -0x7ffffff8);
                auVar41._4_4_ = -(uint)(iVar25 < -0x7ffffff8);
                auVar41._8_4_ = -(uint)(iVar28 < -0x7ffffff7);
                auVar41._12_4_ = -(uint)(iVar28 < -0x7ffffff7);
                auVar33._0_4_ = -(uint)(auVar27._4_4_ == -0x80000000);
                auVar33._4_4_ = -(uint)(auVar27._4_4_ == -0x80000000);
                auVar33._8_4_ = -(uint)(auVar27._12_4_ == -0x80000000);
                auVar33._12_4_ = -(uint)(auVar27._12_4_ == -0x80000000);
                auVar33 = auVar33 & auVar41;
                auVar26 = pshuflw(auVar41,auVar33,0xe8);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  pCell->CanonPerm[8] = '\b';
                }
                auVar26 = packssdw(auVar33,auVar33);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._8_2_ >> 8 & 1) != 0) {
                  pCell->CanonPerm[9] = '\t';
                }
                auVar42._0_4_ = -(uint)(iVar25 < -0x7ffffff6);
                auVar42._4_4_ = -(uint)(iVar25 < -0x7ffffff6);
                auVar42._8_4_ = -(uint)(iVar28 < -0x7ffffff5);
                auVar42._12_4_ = -(uint)(iVar28 < -0x7ffffff5);
                auVar34._0_4_ = -(uint)(auVar27._4_4_ == -0x80000000);
                auVar34._4_4_ = -(uint)(auVar27._4_4_ == -0x80000000);
                auVar34._8_4_ = -(uint)(auVar27._12_4_ == -0x80000000);
                auVar34._12_4_ = -(uint)(auVar27._12_4_ == -0x80000000);
                auVar34 = auVar34 & auVar42;
                auVar26 = packssdw(auVar42,auVar34);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  pCell->CanonPerm[10] = '\n';
                }
                auVar26 = pshufhw(auVar34,auVar34,0x84);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._10_2_ >> 8 & 1) != 0) {
                  pCell->CanonPerm[0xb] = '\v';
                }
                auVar43._0_4_ = -(uint)(iVar25 < -0x7ffffff4);
                auVar43._4_4_ = -(uint)(iVar25 < -0x7ffffff4);
                auVar43._8_4_ = -(uint)(iVar28 < -0x7ffffff3);
                auVar43._12_4_ = -(uint)(iVar28 < -0x7ffffff3);
                auVar35._0_4_ = -(uint)(auVar27._4_4_ == -0x80000000);
                auVar35._4_4_ = -(uint)(auVar27._4_4_ == -0x80000000);
                auVar35._8_4_ = -(uint)(auVar27._12_4_ == -0x80000000);
                auVar35._12_4_ = -(uint)(auVar27._12_4_ == -0x80000000);
                auVar35 = auVar35 & auVar43;
                auVar26 = pshuflw(auVar43,auVar35,0xe8);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined1 *)pCell->Store = 0xc;
                }
                auVar26 = packssdw(auVar35,auVar35);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._12_2_ >> 8 & 1) != 0) {
                  *(undefined1 *)((long)pCell->Store + 1) = 0xd;
                }
                auVar36._0_4_ = -(uint)(iVar25 < -0x7ffffff2);
                auVar36._4_4_ = -(uint)(iVar25 < -0x7ffffff2);
                auVar36._8_4_ = -(uint)(iVar28 < -0x7ffffff1);
                auVar36._12_4_ = -(uint)(iVar28 < -0x7ffffff1);
                auVar22._0_4_ = -(uint)(auVar27._4_4_ == -0x80000000);
                auVar22._4_4_ = -(uint)(auVar27._4_4_ == -0x80000000);
                auVar22._8_4_ = -(uint)(auVar27._12_4_ == -0x80000000);
                auVar22._12_4_ = -(uint)(auVar27._12_4_ == -0x80000000);
                auVar22 = auVar22 & auVar36;
                auVar26 = packssdw(auVar27,auVar22);
                auVar26 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined1 *)(pCell->Store + 1) = 0xe;
                }
                auVar26 = pshufhw(auVar22,auVar22,0x84);
                auVar23 = packssdw(auVar26 ^ auVar23,auVar26 ^ auVar23);
                auVar23 = packsswb(auVar23,auVar23);
                if ((auVar23._14_2_ >> 8 & 1) != 0) {
                  *(undefined1 *)((long)pCell->Store + 3) = 0xf;
                }
              }
              uVar6 = *(uint *)&pCVar9->field_0x20 & 0xf;
              uVar20 = (ulong)(uint)(1 << ((char)uVar6 - 5U & 0x1f));
              if (uVar6 < 6) {
                uVar20 = 1;
              }
              lVar18 = uVar20 + 0x14;
              do {
                *(undefined4 *)(pCell->Box + lVar18 * 4 + -0x1c) =
                     *(undefined4 *)(pCVar9->Box + lVar18 * 4 + -0x1c);
                uVar20 = lVar18 - 0x14;
                lVar18 = lVar18 + -1;
              } while (1 < uVar20);
              uVar6 = *(uint *)&pCell->field_0x20 & 0xf;
              *(uint *)&pCell->field_0x20 =
                   iVar7 * 0x1000 + (int)local_a8 +
                   (*(uint *)&pCell->field_0x20 & 0xffffc00f | iVar5 << 4);
              uVar20 = (ulong)(uint)(1 << ((char)uVar6 - 5U & 0x1f));
              if (uVar6 < 6) {
                uVar20 = 1;
              }
              do {
                Cut_CellSuppMin::uTemp[uVar20 + 0xf] = pCell->uTruth[uVar20 - 1];
                bVar4 = 1 < uVar20;
                uVar20 = uVar20 - 1;
              } while (bVar4);
              uVar6 = *(uint *)&pCell->field_0x20 & 0xf;
              uVar20 = (ulong)(uint)(1 << ((char)uVar6 - 5U & 0x1f));
              if (uVar6 < 6) {
                uVar20 = 1;
              }
              do {
                *(uint *)(Cut_CellCrossBar_uTemp0 + uVar20 * 4 + 0x3c) = pCell->uTruth[uVar20 - 1];
                bVar4 = 1 < uVar20;
                uVar20 = uVar20 - 1;
              } while (bVar4);
              uVar6 = *(uint *)&pCell->field_0x20;
              local_a0 = (uint *)CONCAT44(local_a0._4_4_,iVar7);
              if (uVar6 < 0x4000) {
                Extra_TruthCofactor0((uint *)Cut_CellCrossBar_uTemp0,uVar6 & 0xf,uVar6 >> 4 & 0xf);
                Extra_TruthCofactor0
                          ((uint *)Cut_CellCrossBar_uTemp0,*(uint *)&pCell->field_0x20 & 0xf,
                           *(uint *)&pCell->field_0x20 >> 8 & 0xf);
                Extra_TruthCofactor1
                          ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                           *(uint *)&pCell->field_0x20 >> 4 & 0xf);
LAB_0043f21e:
                Extra_TruthCofactor1
                          ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                           *(uint *)&pCell->field_0x20 >> 8 & 0xf);
              }
              else {
                if (uVar6 >> 0xe != 2) {
                  if (uVar6 >> 0xe != 1) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutPre22.c"
                                  ,0x26f,"void Cut_CellCrossBar(Cut_Cell_t *)");
                  }
                  Extra_TruthCofactor1((uint *)Cut_CellCrossBar_uTemp0,uVar6 & 0xf,uVar6 >> 4 & 0xf)
                  ;
                  Extra_TruthCofactor0
                            ((uint *)Cut_CellCrossBar_uTemp0,*(uint *)&pCell->field_0x20 & 0xf,
                             *(uint *)&pCell->field_0x20 >> 8 & 0xf);
                  Extra_TruthCofactor0
                            ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                             *(uint *)&pCell->field_0x20 >> 4 & 0xf);
                  goto LAB_0043f21e;
                }
                Extra_TruthCofactor0((uint *)Cut_CellCrossBar_uTemp0,uVar6 & 0xf,uVar6 >> 4 & 0xf);
                Extra_TruthCofactor1
                          ((uint *)Cut_CellCrossBar_uTemp0,*(uint *)&pCell->field_0x20 & 0xf,
                           *(uint *)&pCell->field_0x20 >> 8 & 0xf);
                Extra_TruthCofactor1
                          ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                           *(uint *)&pCell->field_0x20 >> 4 & 0xf);
                Extra_TruthCofactor0
                          ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                           *(uint *)&pCell->field_0x20 >> 8 & 0xf);
              }
              Extra_TruthMux(pCell->uTruth,(uint *)Cut_CellCrossBar_uTemp0,
                             (uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                             *(uint *)&pCell->field_0x20 >> 4 & 0xf);
              Cut_CellSuppMin(pCell);
              psVar2 = pCell->Store;
              uVar6 = Extra_TruthSemiCanonicize
                                (pCell->uTruth,local_90,*(uint *)&pCell->field_0x20 & 0xf,
                                 pCell->CanonPerm,psVar2);
              *(uint *)&pCell->field_0x20 = *(uint *)&pCell->field_0x20 & 0x3fff | uVar6 << 0xe;
              p->nTotal = p->nTotal + 1;
              iVar7 = Cut_CellTableLookup(p,pCell);
              if (iVar7 == 0) {
                p->nGood = p->nGood + 1;
                p->nVarCounts[*(uint *)&pCell->field_0x20 & 0xf] =
                     p->nVarCounts[*(uint *)&pCell->field_0x20 & 0xf] + 1;
                uVar6 = *(uint *)&pCell->field_0x20;
                uVar15 = uVar6 & 0xf;
                if (1 < uVar15) {
                  uVar12 = 0;
                  do {
                    sVar3 = psVar2[(int)(uVar12 * 2)];
                    uVar1 = uVar12 + 1;
                    if (sVar3 == psVar2[(int)(uVar12 * 2 + 2)]) {
                      uVar20 = (ulong)uVar1;
                      if ((int)uVar1 < (int)uVar15) {
                        puVar16 = pCell->uTruth + (long)(int)uVar12 + -8;
                        uVar11 = (long)(int)uVar12 + 1;
                        do {
                          uVar20 = uVar11;
                          if (sVar3 != (short)*puVar16) break;
                          uVar11 = uVar11 + 1;
                          puVar16 = puVar16 + 1;
                          uVar20 = (ulong)uVar15;
                        } while (uVar15 != uVar11);
                      }
                      piVar14 = local_b0;
                      if (sVar3 == pCell->Store[(int)(uVar12 * 2 | 1)]) {
                        piVar14 = piVar8;
                      }
                      piVar14[(int)((uint)uVar20 - uVar12)] =
                           piVar14[(int)((uint)uVar20 - uVar12)] + 1;
                      uVar6 = *(uint *)&pCell->field_0x20;
                      uVar1 = (uint)uVar20;
                    }
                    uVar12 = uVar1;
                    uVar15 = uVar6 & 0xf;
                  } while ((int)uVar12 < (int)(uVar15 - 1));
                }
              }
              else {
                Extra_MmFixedEntryRecycle(p->pMem,(char *)pCell);
              }
              iVar7 = (int)local_a0 + 1;
            } while (iVar7 != 3);
            uVar20 = (ulong)((int)local_38 + 1);
            uVar11 = local_40;
          } while (uVar20 < local_40);
        }
      } while (uVar11 != local_98);
      uVar20 = local_40;
    }
    iVar5 = 0x87b35c;
    printf("VAR %d: Total = %d. Good = %d. Entry = %d. ",uVar11 & 0xffffffff,(ulong)(uint)p->nTotal,
           (ulong)(uint)p->nGood,0x98);
    Abc_Print(iVar5,"%s =","Time");
    iVar7 = 3;
    iVar5 = clock_gettime(3,&local_c8);
    if (iVar5 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = local_c8.tv_nsec / 1000 + local_c8.tv_sec * 1000000;
    }
    Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar18 - local_b8) / 1000000.0);
    printf("Cells:  ");
    uVar20 = 0;
    do {
      printf("%d=%d ",uVar20 & 0xffffffff,(ulong)(uint)p->nVarCounts[uVar20]);
      uVar20 = uVar20 + 1;
    } while (uVar20 != 10);
    printf("\nDiffs:  ");
    uVar20 = 0;
    do {
      printf("%d=%d ",uVar20 & 0xffffffff,(ulong)(uint)local_b0[uVar20]);
      uVar20 = uVar20 + 1;
    } while (uVar20 != 10);
    printf("\nEquals: ");
    uVar20 = 0;
    do {
      printf("%d=%d ",uVar20 & 0xffffffff,(ulong)(uint)piVar8[uVar20]);
      uVar20 = uVar20 + 1;
    } while (uVar20 != 10);
    iVar5 = 10;
    putchar(10);
    uVar20 = uVar11 - 1;
    if (uVar11 < 5) {
      Abc_Print(iVar5,"%s =","Supp ");
      Abc_Print(iVar5,"%9.2f sec\n",(double)p->timeSupp / 1000000.0);
      Abc_Print(iVar5,"%s =","Canon");
      Abc_Print(iVar5,"%9.2f sec\n",(double)p->timeCanon / 1000000.0);
      Abc_Print(iVar5,"%s =","Table");
      Abc_Print(iVar5,"%9.2f sec\n",(double)p->timeTable / 1000000.0);
      return;
    }
  } while( true );
}

Assistant:

void Cut_CellPrecompute()
{
    Cut_CMan_t * p;
    Cut_Cell_t * pCell, * pTemp;
    int i1, i2, i3, i, j, k, c;
    abctime clk = Abc_Clock(); //, clk2 = Abc_Clock();

    p = Cut_CManStart();

    // precompute truth tables
    for ( i = 0; i < 22; i++ )
        Cut_CellTruthElem( p->uInputs[0], p->uInputs[1], p->uInputs[2], p->uTemp1[i], 9, i );
    for ( i = 0; i < 22; i++ )
        Cut_CellTruthElem( p->uInputs[3], p->uInputs[4], p->uInputs[5], p->uTemp2[i], 9, i );
    for ( i = 0; i < 22; i++ )
        Cut_CellTruthElem( p->uInputs[6], p->uInputs[7], p->uInputs[8], p->uTemp3[i], 9, i );
/*
        if ( k == 8 && ((i1 == 6 && i2 == 14 && i3 == 20) || (i1 == 20 && i2 == 6 && i3 == 14)) )
        {
            Extra_PrintBinary( stdout, &pCell->CanonPhase, pCell->nVars+1 ); printf( " : " );
            for ( i = 0; i < pCell->nVars; i++ )
                printf( "%d=%d/%d  ", pCell->CanonPerm[i], pCell->Store[2*i], pCell->Store[2*i+1] );
            Extra_PrintHexadecimal( stdout, pCell->uTruth, pCell->nVars );
            printf( "\n" );
        }
*/
/*
    // go through symmetric roots
    for ( k = 0; k < 5; k++ )
    for ( i1 =  0; i1 < 22; i1++ )
    for ( i2 = i1; i2 < 22; i2++ )
    for ( i3 = i2; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = s_NPNe3s[k];
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, s_NPNe3s[k] );
        // canonicize
        Cut_CellCanonicize( pCell );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
            p->nGood++;
    }

    // go through partially symmetric roots
    for ( k = 0; k < 4; k++ )
    for ( i1 = 0;  i1 < 22; i1++ )
    for ( i2 = 0;  i2 < 22; i2++ )
    for ( i3 = i2; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = s_NPNe3p[k];
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, s_NPNe3p[k] );
        // canonicize
        Cut_CellCanonicize( pCell );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
            p->nGood++;
    }

    // go through non-symmetric functions
    for ( i1 = 0; i1 < 22; i1++ )
    for ( i2 = 0; i2 < 22; i2++ )
    for ( i3 = 0; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = 17;
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, 17 );
        // canonicize
        Cut_CellCanonicize( pCell );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
            p->nGood++;
    }
*/

    // go through non-symmetric functions
    for ( k = 0; k < 10; k++ )
    for ( i1 = 0; i1 < 22; i1++ )
    for ( i2 = 0; i2 < 22; i2++ )
    for ( i3 = 0; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = s_NPNe3[k];
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // set the elementary permutation
        for ( i = 0; i < (int)pCell->nVars; i++ )
            pCell->CanonPerm[i] = i;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, s_NPNe3[k] );
        // minimize the support
        Cut_CellSuppMin( pCell );

        // canonicize
        pCell->CanonPhase = Extra_TruthSemiCanonicize( pCell->uTruth, p->puAux, pCell->nVars, pCell->CanonPerm, pCell->Store );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
        {
            p->nGood++;
            p->nVarCounts[pCell->nVars]++;

            if ( pCell->nVars )
            for ( i = 0; i < (int)pCell->nVars-1; i++ )
            {
                if ( pCell->Store[2*i] != pCell->Store[2*(i+1)] ) // i and i+1 cannot be symmetric
                    continue;
                // i and i+1 can be symmetric
                // find the end of this group
                for ( j = i+1; j < (int)pCell->nVars; j++ )
                    if ( pCell->Store[2*i] != pCell->Store[2*j] ) 
                        break;

                if ( pCell->Store[2*i] == pCell->Store[2*i+1] )
                    p->nSymGroupsE[j-i]++;
                else
                    p->nSymGroups[j-i]++;
                i = j - 1;
            }
/*
            if ( pCell->nVars == 3 )
            {
                Extra_PrintBinary( stdout, pCell->uTruth, 32 ); printf( "\n" );
                for ( i = 0; i < (int)pCell->nVars; i++ )
                    printf( "%d=%d/%d  ", pCell->CanonPerm[i], pCell->Store[2*i], pCell->Store[2*i+1] );
                printf( "\n" );
            }
*/
        }
    }

    printf( "BASIC: Total = %d. Good = %d. Entry = %d. ", (int)p->nTotal, (int)p->nGood, (int)sizeof(Cut_Cell_t) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    printf( "Cells:  " );
    for ( i = 0; i <= 9; i++ )
        printf( "%d=%d ", i, p->nVarCounts[i] );
    printf( "\nDiffs:  " );
    for ( i = 0; i <= 9; i++ )
        printf( "%d=%d ", i, p->nSymGroups[i] );
    printf( "\nEquals: " );
    for ( i = 0; i <= 9; i++ )
        printf( "%d=%d ", i, p->nSymGroupsE[i] );
    printf( "\n" );

    // continue adding new cells using support
    for ( k = CUT_CELL_MVAR; k > 3; k-- )
    {
        for ( pTemp = p->pSameVar[k]; pTemp; pTemp = pTemp->pNextVar )
        for ( i1 = 0; i1 < k; i1++ )
        for ( i2 = i1+1; i2 < k; i2++ )
        for ( c = 0; c < 3; c++ )
        {
            // derive the cell
            pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
            memset( pCell, 0, sizeof(Cut_Cell_t) );
            pCell->nVars   = pTemp->nVars;
            pCell->pParent = pTemp;
            // set the elementary permutation
            for ( i = 0; i < (int)pCell->nVars; i++ )
                pCell->CanonPerm[i] = i;
            // fill in the truth table
            Extra_TruthCopy( pCell->uTruth, pTemp->uTruth, pTemp->nVars );
            // create the cross-bar
            pCell->CrossBar0 = i1;
            pCell->CrossBar1 = i2;
            pCell->CrossBarPhase = c;
            Cut_CellCrossBar( pCell );
            // minimize the support
//clk2 = Abc_Clock();
            Cut_CellSuppMin( pCell );
//p->timeSupp += Abc_Clock() - clk2;
            // canonicize
//clk2 = Abc_Clock();
            pCell->CanonPhase = Extra_TruthSemiCanonicize( pCell->uTruth, p->puAux, pCell->nVars, pCell->CanonPerm, pCell->Store );
//p->timeCanon += Abc_Clock() - clk2;

            // add to the table
//clk2 = Abc_Clock();
            p->nTotal++;
            if ( Cut_CellTableLookup( p, pCell ) ) // already exists
                Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
            else
            {
                p->nGood++;
                p->nVarCounts[pCell->nVars]++;

                for ( i = 0; i < (int)pCell->nVars-1; i++ )
                {
                    if ( pCell->Store[2*i] != pCell->Store[2*(i+1)] ) // i and i+1 cannot be symmetric
                        continue;
                    // i and i+1 can be symmetric
                    // find the end of this group
                    for ( j = i+1; j < (int)pCell->nVars; j++ )
                        if ( pCell->Store[2*i] != pCell->Store[2*j] ) 
                            break;

                    if ( pCell->Store[2*i] == pCell->Store[2*i+1] )
                        p->nSymGroupsE[j-i]++;
                    else
                        p->nSymGroups[j-i]++;
                    i = j - 1;
                }
/*
                if ( pCell->nVars == 3 )
                {
                    Extra_PrintBinary( stdout, pCell->uTruth, 32 ); printf( "\n" );
                    for ( i = 0; i < (int)pCell->nVars; i++ )
                        printf( "%d=%d/%d  ", pCell->CanonPerm[i], pCell->Store[2*i], pCell->Store[2*i+1] );
                    printf( "\n" );
                }
*/
            }
//p->timeTable += Abc_Clock() - clk2;
        }

        printf( "VAR %d: Total = %d. Good = %d. Entry = %d. ", k, p->nTotal, p->nGood, (int)sizeof(Cut_Cell_t) );
        ABC_PRT( "Time", Abc_Clock() - clk );
        printf( "Cells:  " );
        for ( i = 0; i <= 9; i++ )
            printf( "%d=%d ", i, p->nVarCounts[i] );
        printf( "\nDiffs:  " );
        for ( i = 0; i <= 9; i++ )
            printf( "%d=%d ", i, p->nSymGroups[i] );
        printf( "\nEquals: " );
        for ( i = 0; i <= 9; i++ )
            printf( "%d=%d ", i, p->nSymGroupsE[i] );
        printf( "\n" );
    }
//    printf( "\n" );
    ABC_PRT( "Supp ", p->timeSupp );
    ABC_PRT( "Canon", p->timeCanon );
    ABC_PRT( "Table", p->timeTable );
//    Cut_CManStop( p );
}